

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall UdpSocketImpl::SelectThread(UdpSocketImpl *this)

{
  atomic_uchar *paVar1;
  BaseSocket *pBVar2;
  int32_t __n;
  __array __args;
  uint __i;
  int iVar3;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s;
  long lVar4;
  ulong uVar5;
  ssize_t sVar6;
  ostream *poVar7;
  char *pcVar8;
  int *piVar9;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __result;
  UdpSocket *__args_00;
  int *piVar10;
  unsigned_long __args_1;
  bool bVar11;
  bool bReadCall;
  int32_t transferred;
  __array tmp;
  __array buf;
  socklen_t sinLen;
  pthread_mutex_t *local_370;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_368;
  function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string caAddrBuf;
  anon_union_28_2_13231a05 SenderAddr;
  timeval local_2f8;
  mutex mxNotify;
  fd_set errorfd;
  fd_set readfd;
  socklen_t iLen;
  undefined4 uStack_1b4;
  ostream local_1a8 [376];
  
  bReadCall = false;
  mxNotify.super___mutex_base._M_mutex._16_8_ = 0;
  mxNotify.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mxNotify.super___mutex_base._M_mutex.__align = 0;
  mxNotify.super___mutex_base._M_mutex._8_8_ = 0;
  mxNotify.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(0xffff);
  memset((void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,0,0xffff);
  local_360 = &this->m_fnSslDecode;
  local_370 = (pthread_mutex_t *)&this->m_mxInDeque;
  local_368 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
               *)&this->m_quInData;
  piVar10 = &(this->super_BaseSocketImpl).m_iError;
  buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  do {
    while( true ) {
      do {
        do {
          while( true ) {
            if ((this->super_BaseSocketImpl).m_bStop != false) goto LAB_00119aa3;
            if ((this->m_atInBytes).super___atomic_base<unsigned_long>._M_i < 0x40001) break;
            _iLen = 1;
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&iLen);
          }
          readfd.fds_bits[0xe] = 0;
          readfd.fds_bits[0xf] = 0;
          readfd.fds_bits[0xc] = 0;
          readfd.fds_bits[0xd] = 0;
          readfd.fds_bits[10] = 0;
          readfd.fds_bits[0xb] = 0;
          readfd.fds_bits[8] = 0;
          readfd.fds_bits[9] = 0;
          readfd.fds_bits[6] = 0;
          readfd.fds_bits[7] = 0;
          readfd.fds_bits[4] = 0;
          readfd.fds_bits[5] = 0;
          readfd.fds_bits[2] = 0;
          readfd.fds_bits[3] = 0;
          readfd.fds_bits[0] = 0;
          readfd.fds_bits[1] = 0;
          errorfd.fds_bits[0xe] = 0;
          errorfd.fds_bits[0xf] = 0;
          errorfd.fds_bits[0xc] = 0;
          errorfd.fds_bits[0xd] = 0;
          errorfd.fds_bits[10] = 0;
          errorfd.fds_bits[0xb] = 0;
          errorfd.fds_bits[8] = 0;
          errorfd.fds_bits[9] = 0;
          errorfd.fds_bits[6] = 0;
          errorfd.fds_bits[7] = 0;
          errorfd.fds_bits[4] = 0;
          errorfd.fds_bits[5] = 0;
          errorfd.fds_bits[2] = 0;
          errorfd.fds_bits[3] = 0;
          errorfd.fds_bits[0] = 0;
          errorfd.fds_bits[1] = 0;
          local_2f8.tv_sec = 2;
          local_2f8.tv_usec = 0;
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            readfd.fds_bits[lVar4] = 0;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            errorfd.fds_bits[lVar4] = 0;
          }
          iVar3 = (this->super_BaseSocketImpl).m_fSock;
          uVar5 = 1L << ((byte)iVar3 & 0x3f);
          readfd.fds_bits[iVar3 / 0x40] = readfd.fds_bits[iVar3 / 0x40] | uVar5;
          errorfd.fds_bits[iVar3 / 0x40] = errorfd.fds_bits[iVar3 / 0x40] | uVar5;
          iVar3 = select(iVar3 + 1,(fd_set *)&readfd,(fd_set *)0x0,(fd_set *)&errorfd,&local_2f8);
        } while (iVar3 < 1);
        iVar3 = (this->super_BaseSocketImpl).m_fSock;
        if (((ulong)errorfd.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0) {
          iLen = 4;
          getsockopt(iVar3,1,4,piVar10,&iLen);
          (this->super_BaseSocketImpl).m_iErrLoc = 7;
          bVar11 = (this->super_BaseSocketImpl).m_bStop;
          if (bVar11 == false &&
              (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            std::function<void_(BaseSocket_*,_void_*)>::operator()
                      (&(this->super_BaseSocketImpl).m_fErrorParam,
                       (this->super_BaseSocketImpl).m_pBkRef,
                       (this->super_BaseSocketImpl).m_pvUserData);
          }
          else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                   (_Manager_type)0x0 && bVar11 == false) {
            std::function<void_(BaseSocket_*)>::operator()
                      (&(this->super_BaseSocketImpl).m_fError,(this->super_BaseSocketImpl).m_pBkRef)
            ;
          }
          goto LAB_00119aa3;
        }
      } while ((readfd.fds_bits[iVar3 / 0x40] & 1L << ((byte)((long)iVar3 % 0x40) & 0x3f)) == 0);
      sinLen = 0x1c;
      sVar6 = recvfrom(iVar3,(void *)buf._M_t.
                                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                     super__Head_base<0UL,_char_*,_false>._M_head_impl,0xffff,0,
                       (sockaddr *)&SenderAddr.sin,&sinLen);
      transferred = (int32_t)sVar6;
      if (transferred < 1) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&iLen);
      caAddrBuf._M_dataplus._M_p = (pointer)&caAddrBuf.field_2;
      std::__cxx11::string::_M_construct((ulong)&caAddrBuf,'/');
      if (SenderAddr.sin.sin_family == 10) {
        poVar7 = std::operator<<(local_1a8,"[");
        pcVar8 = inet_ntop((uint)SenderAddr.sin.sin_family,SenderAddr.sin.sin_zero,
                           caAddrBuf._M_dataplus._M_p,0x20);
        std::operator<<(poVar7,pcVar8);
        pcVar8 = "]:";
      }
      else {
        pcVar8 = inet_ntop((uint)SenderAddr.sin.sin_family,&SenderAddr.sin.sin_addr,
                           caAddrBuf._M_dataplus._M_p,0x20);
        std::operator<<(local_1a8,pcVar8);
        pcVar8 = ":";
      }
      poVar7 = std::operator<<(local_1a8,pcVar8);
      std::ostream::operator<<(poVar7,SenderAddr.sin.sin_port << 8 | SenderAddr.sin.sin_port >> 8);
      __args = buf;
      if ((this->m_fnSslDecode).super__Function_base._M_manager == (_Manager_type)0x0) {
        bVar11 = true;
LAB_0011977f:
        __n = transferred;
        uVar5 = (ulong)transferred;
        __result.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
             operator_new__(uVar5);
        memset((void *)__result.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar5);
        tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             __result.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
             _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        std::copy_n<char*,int,unsigned_char*>
                  ((char *)buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl,__n,
                   (uchar *)__result.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        std::mutex::lock((mutex *)&local_370->__data);
        std::__cxx11::stringbuf::str();
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,int&,std::__cxx11::string>
                  (local_368,&tmp,&transferred,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        LOCK();
        (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
             (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i + (long)transferred;
        UNLOCK();
        pthread_mutex_unlock(local_370);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&tmp);
      }
      else {
        __args_1 = (unsigned_long)transferred;
        std::__cxx11::stringbuf::str();
        iVar3 = std::
                function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()(local_360,
                             (uchar *)__args._M_t.
                                      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                                      .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                      super__Head_base<0UL,_char_*,_false>._M_head_impl,__args_1,
                             &local_358);
        bVar11 = iVar3 != -1;
        std::__cxx11::string::~string((string *)&local_358);
        if (iVar3 == 0) goto LAB_0011977f;
      }
      if (((this->m_fBytesReceivedParam).super__Function_base._M_manager != (_Manager_type)0x0 ||
           (this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0) &&
         (bVar11 && (this->super_BaseSocketImpl).m_bStop == false)) {
        std::mutex::lock(&mxNotify);
        if (bReadCall == false) {
          bReadCall = true;
          tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
          local_358._M_dataplus._M_p = (pointer)operator_new(0x20);
          *(undefined ***)local_358._M_dataplus._M_p = &PTR___State_00146848;
          *(mutex **)((long)local_358._M_dataplus._M_p + 8) = &mxNotify;
          *(UdpSocketImpl **)((long)local_358._M_dataplus._M_p + 0x10) = this;
          *(bool **)((long)local_358._M_dataplus._M_p + 0x18) = &bReadCall;
          std::thread::_M_start_thread((thread *)&tmp,&local_358,0);
          if ((long *)local_358._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_358._M_dataplus._M_p + 8))();
          }
          std::thread::detach();
          std::thread::~thread((thread *)&tmp);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&mxNotify);
      }
      std::__cxx11::string::~string((string *)&caAddrBuf);
      std::__cxx11::stringstream::~stringstream((stringstream *)&iLen);
    }
    if (transferred == 0) {
      iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
      if (iVar3 != 0) {
        piVar10 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar10;
        (this->super_BaseSocketImpl).m_iErrLoc = 9;
      }
      while (bReadCall == true) {
        _iLen = 10;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&iLen);
      }
      pBVar2 = (this->super_BaseSocketImpl).m_pBkRef;
      if (pBVar2 == (BaseSocket *)0x0) {
        __args_00 = (UdpSocket *)0x0;
      }
      else {
        __args_00 = (UdpSocket *)__dynamic_cast(pBVar2,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0)
        ;
      }
      if (__args_00 == (UdpSocket *)0x0 ||
          (this->m_fBytesReceivedParam).super__Function_base._M_manager == (_Manager_type)0x0) {
        if ((this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0 &&
            __args_00 != (UdpSocket *)0x0) {
          std::function<void_(UdpSocket_*)>::operator()(&this->m_fBytesReceived,__args_00);
        }
      }
      else {
        std::function<void_(UdpSocket_*,_void_*)>::operator()
                  (&this->m_fBytesReceivedParam,__args_00,(this->super_BaseSocketImpl).m_pvUserData)
        ;
      }
      goto LAB_00119acc;
    }
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    *piVar10 = iVar3;
  } while (iVar3 == 0xb);
  (this->super_BaseSocketImpl).m_iErrLoc = 0xb;
  bVar11 = (this->super_BaseSocketImpl).m_bStop;
  if (bVar11 == false &&
      (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    std::function<void_(BaseSocket_*,_void_*)>::operator()
              (&(this->super_BaseSocketImpl).m_fErrorParam,(this->super_BaseSocketImpl).m_pBkRef,
               (this->super_BaseSocketImpl).m_pvUserData);
  }
  else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
           (_Manager_type)0x0 && bVar11 == false) {
    std::function<void_(BaseSocket_*)>::operator()
              (&(this->super_BaseSocketImpl).m_fError,(this->super_BaseSocketImpl).m_pBkRef);
  }
LAB_00119aa3:
  if ((*piVar10 == 0) && (iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,0), iVar3 != 0)) {
    piVar10 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar10;
    (this->super_BaseSocketImpl).m_iErrLoc = 10;
  }
LAB_00119acc:
  while (bReadCall == true) {
    _iLen = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&iLen);
  }
  std::mutex::lock(&mxNotify);
  pthread_mutex_unlock((pthread_mutex_t *)&mxNotify);
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i | 1;
  UNLOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  LOCK();
  bVar11 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\x03';
  if (bVar11) {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
  }
  UNLOCK();
  if (bVar11) {
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    if (iVar3 != -1) {
      close(iVar3);
    }
    (this->super_BaseSocketImpl).m_fSock = -1;
    if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
        (_Manager_type)0x0 ||
        (this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
    }
  }
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buf);
  return;
}

Assistant:

void UdpSocketImpl::SelectThread()
{
    bool bReadCall = false;
    mutex mxNotify;
    bool bSocketShutDown = false;
	auto buf = make_unique<char[]>(0x0000ffff);

    while (m_bStop == false)
    {
        if (m_atInBytes > 0x40000)  // More than 256 KB in the receive buffer
        {
            this_thread::sleep_for(chrono::milliseconds(1));
            continue;
        }

        fd_set readfd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &readfd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 7;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &readfd))
            {
                union
                {
                    sockaddr_in sin;
                    sockaddr_in6 sin6;
                }SenderAddr;
                socklen_t sinLen = sizeof(SenderAddr);

                int32_t transferred = ::recvfrom(m_fSock, &buf[0], 0x0000ffff, 0, reinterpret_cast<sockaddr*>(&SenderAddr), &sinLen);

                if (transferred <= 0)
                {
                    if (transferred == 0)
                    {   // The connection was shutdown from the other side, there will be no more bytes to read on that connection
                        // We set the flag, so we don't read on the connection any more
                        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                        {
                            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                            m_iErrLoc = 9;
                        }
                        bSocketShutDown = true;

                        while (bReadCall == true)
                            this_thread::sleep_for(chrono::milliseconds(10));

                        UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                        if (m_fBytesReceivedParam && pUdpSocket != nullptr)
                            m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                        else if (m_fBytesReceived && pUdpSocket != nullptr)
                            m_fBytesReceived(pUdpSocket);
                        break;
                    }
                    else
                    {
                        m_iError = WSAGetLastError();
                        if (m_iError != WSAEWOULDBLOCK)
                        {
                            m_iErrLoc = 11;
                            if (m_fErrorParam && m_bStop == false)
                                m_fErrorParam(m_pBkRef, m_pvUserData);
                            else if (m_fError && m_bStop == false)
                                m_fError(m_pBkRef);
                            break;
                        }
                    }
                }
                else
                {
                    stringstream strAbsender;
                    string caAddrBuf(INET6_ADDRSTRLEN + 1, 0);
                    if (SenderAddr.sin6.sin6_family == AF_INET6)
                    {
                        strAbsender << "[" << inet_ntop(SenderAddr.sin6.sin6_family, &SenderAddr.sin6.sin6_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << "]:" << ntohs(SenderAddr.sin6.sin6_port);
                    }
                    else
                    {
                        strAbsender << inet_ntop(SenderAddr.sin.sin_family, &SenderAddr.sin.sin_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << ":" << ntohs(SenderAddr.sin.sin_port);
                    }

                    int iRet = 0;
                    if (m_fnSslDecode == nullptr || (iRet = m_fnSslDecode(reinterpret_cast<uint8_t*>(&buf[0]), transferred, strAbsender.str()), iRet == 0))
                    {
                        auto tmp = make_unique<uint8_t[]>(transferred);
                        copy_n(&buf[0], transferred, &tmp[0]);
                        m_mxInDeque.lock();
                        m_quInData.emplace_back(move(tmp), transferred, strAbsender.str());
                        m_atInBytes += transferred;
                        m_mxInDeque.unlock();
                    }

                    if ((m_fBytesReceived || m_fBytesReceivedParam) && m_bStop == false && iRet != -1)
                    {
                        lock_guard<mutex> lock(mxNotify);
                        if (bReadCall == false)
                        {
                            bReadCall = true;
                            thread([&]()
                            {
                                mxNotify.lock();
                                while (m_atInBytes > 0 && m_bStop == false)
                                {
                                    UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                                    mxNotify.unlock();
                                    if (m_fBytesReceivedParam != nullptr && pUdpSocket != nullptr)
                                        m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                                    else if (pUdpSocket != nullptr)
                                        m_fBytesReceived(pUdpSocket);
                                    mxNotify.lock();
                                }
                                bReadCall = false;
                                mxNotify.unlock();
                            }).detach();
                        }
                    }
                }
            }
        }
    }

    if (bSocketShutDown == false && m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error RECEIVE shutdown socket\r\n");
            m_iErrLoc = 10;
        }
    }

    while (bReadCall == true)
        this_thread::sleep_for(chrono::milliseconds(10));

    mxNotify.lock();    // In rare cases, bReadCall was set to false, and the task switch
    mxNotify.unlock();  // ended that thread before the lambda thread released mxNotify -> crash

    m_iShutDownState |= 1;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}